

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall
kratos::FunctionReturnVisitor::visit(FunctionReturnVisitor *this,Generator *generator)

{
  Stmt *stmt;
  _Base_ptr this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  pointer ppVar5;
  StmtException *this_02;
  long lVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  ulong uVar7;
  string_view format_str;
  format_args args;
  undefined1 local_f0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  functions;
  const_iterator local_b8;
  undefined8 uStack_b0;
  Stmt **local_a0;
  undefined8 uStack_98;
  Stmt *local_90 [2];
  long local_80;
  undefined1 auStack_78 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmts;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
              *)local_f0,&(generator->funcs_)._M_t);
  p_Var4 = functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&functions) {
    do {
      stmt = *(Stmt **)(p_Var4 + 2);
      this_00 = p_Var4[2]._M_parent;
      if (this_00 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        }
      }
      iVar3 = (*(stmt->super_IRNode)._vptr_IRNode[0xe])(stmt);
      if (((char)iVar3 != '\0') &&
         (iVar3 = (*(stmt->super_IRNode)._vptr_IRNode[0x10])(stmt), (char)iVar3 == '\0')) {
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        local_40 = std::
                   _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:492:17)>
                   ::_M_invoke;
        local_48 = std::
                   _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:492:17)>
                   ::_M_manager;
        bVar2 = check_stmt_condition(stmt,(function<bool_(kratos::Stmt_*)> *)&local_58,true,true);
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,3);
        }
        if (!bVar2) {
          auStack_78 = (undefined1  [8])0x0;
          stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
                    ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)auStack_78,
                     (long)stmt[1].super_IRNode.fn_name_ln.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start -
                     (long)stmt[1].super_IRNode._vptr_IRNode >> 4);
          ppVar5 = (pointer)stmt[1].super_IRNode._vptr_IRNode;
          if (stmt[1].super_IRNode.fn_name_ln.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start != ppVar5) {
            lVar6 = 8;
            uVar7 = 0;
            do {
              local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)((long)ppVar5 + lVar6 + -8);
              this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)&(ppVar5->first)._M_dataplus._M_p + lVar6);
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                }
              }
              local_80 = lVar6;
              std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::Stmt*>
                        ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_78,
                         (Stmt **)&local_58);
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
              }
              uVar7 = uVar7 + 1;
              ppVar5 = (pointer)stmt[1].super_IRNode._vptr_IRNode;
              lVar6 = local_80 + 0x10;
            } while (uVar7 < (ulong)((long)stmt[1].super_IRNode.fn_name_ln.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start - (long)ppVar5
                                    >> 4));
          }
          this_02 = (StmtException *)__cxa_allocate_exception(0x10);
          local_a0 = local_90;
          pcVar1 = stmt[1].super_IRNode.comment._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar1,
                     pcVar1 + stmt[1].super_IRNode.comment._M_string_length);
          local_b8._M_current = local_a0;
          uStack_b0 = uStack_98;
          format_str.size_ = 0xd;
          format_str.data_ = (char *)0x37;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_b8;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&local_58,
                     (detail *)"{0} does not have return statement in all control flows",format_str,
                     args);
          local_b8._M_current = (Stmt **)auStack_78;
          functions._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          StmtException::StmtException
                    (this_02,(string *)&local_58,&local_b8,
                     (const_iterator *)&functions._M_t._M_impl.super__Rb_tree_header._M_node_count);
          __cxa_throw(this_02,&StmtException::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      if (this_00 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != (_Rb_tree_node_base *)&functions);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
               *)local_f0);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // check all the function definitions
        auto functions = generator->functions();
        for (auto const& iter : functions) {
            auto func = iter.second;
            // check if the function has a return
            if (!func->has_return_value() || func->is_builtin()) continue;
            // build statement graph
            bool has_return = check_stmt_condition(
                func.get(),
                [](Stmt* stmt) -> bool { return stmt->type() == StatementType::Return; }, true);
            if (!has_return) {
                std::vector<Stmt*> stmts;
                stmts.reserve(func->size());
                for (uint64_t i = 0; i < func->size(); i++) {
                    stmts.emplace_back(func->get_stmt(i).get());
                }
                throw StmtException(
                    ::format("{0} does not have return statement in all control flows",
                             func->function_name()),
                    stmts.begin(), stmts.end());
            }
        }
    }